

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charset_matcher.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::
charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,
          matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *next)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  
  pcVar1 = (state->cur_)._M_current;
  if (pcVar1 == (state->end_)._M_current) {
    state->found_partial_match_ = true;
  }
  else {
    bVar2 = compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
            ::test<mpl_::bool_<true>>
                      ((compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                        *)this,(int)*pcVar1,(state->context_).traits_ + 1);
    if (bVar2) {
      (state->cur_)._M_current = (state->cur_)._M_current + 1;
      iVar3 = (*(next->
                super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_matchable[2])(next,state);
      if ((char)iVar3 != '\0') {
        return true;
      }
      (state->cur_)._M_current = (state->cur_)._M_current + -1;
    }
  }
  return false;
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            if(state.eos() || !this->charset_.test(*state.cur_, traits_cast<Traits>(state), icase_type()))
            {
                return false;
            }

            ++state.cur_;
            if(next.match(state))
            {
                return true;
            }

            --state.cur_;
            return false;
        }